

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O3

void __thiscall
deqp::gls::FboUtil::FboBuilder::glAttach(FboBuilder *this,GLenum attPoint,Attachment *att)

{
  Functions *pFVar1;
  GLenum GVar2;
  undefined8 in_RAX;
  long lVar3;
  mapped_type *ppAVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
  pVar5;
  undefined8 local_28;
  
  pFVar1 = this->m_gl;
  local_28 = in_RAX;
  if (att == (Attachment *)0x0) {
    (*pFVar1->framebufferRenderbuffer)(this->m_target,attPoint,0x8d41,0);
    GVar2 = (*this->m_gl->getError)();
    if ((GVar2 != 0) && (this->m_error == 0)) {
      this->m_error = GVar2;
    }
    local_28 = CONCAT44(local_28._4_4_,attPoint);
    pVar5 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
            ::equal_range((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
                           *)this,(key_type_conflict *)&local_28);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
    ::_M_erase_aux((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>,_std::_Select1st<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
                    *)this,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
  }
  else {
    lVar3 = __dynamic_cast(att,&FboUtil::config::Attachment::typeinfo,
                           &FboUtil::config::RenderbufferAttachment::typeinfo,0);
    if (lVar3 == 0) {
      lVar3 = __dynamic_cast(att,&FboUtil::config::Attachment::typeinfo,
                             &FboUtil::config::TextureFlatAttachment::typeinfo,0);
      if (lVar3 == 0) {
        lVar3 = __dynamic_cast(att,&FboUtil::config::Attachment::typeinfo,
                               &FboUtil::config::TextureLayerAttachment::typeinfo,0);
        if (lVar3 != 0) {
          (*pFVar1->framebufferTextureLayer)
                    (*(GLenum *)(lVar3 + 8),attPoint,*(GLuint *)(lVar3 + 0xc),
                     *(GLint *)(lVar3 + 0x10),*(GLint *)(lVar3 + 0x14));
        }
      }
      else {
        (*pFVar1->framebufferTexture2D)
                  (*(GLenum *)(lVar3 + 8),attPoint,*(GLenum *)(lVar3 + 0x14),
                   *(GLuint *)(lVar3 + 0xc),*(GLint *)(lVar3 + 0x10));
      }
    }
    else {
      (*pFVar1->framebufferRenderbuffer)
                (*(GLenum *)(lVar3 + 8),attPoint,*(GLenum *)(lVar3 + 0x10),*(GLuint *)(lVar3 + 0xc))
      ;
    }
    GVar2 = (*this->m_gl->getError)();
    if ((GVar2 != 0) && (this->m_error == 0)) {
      this->m_error = GVar2;
    }
    local_28 = CONCAT44(attPoint,(key_type_conflict)local_28);
    ppAVar4 = std::
              map<unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
              ::operator[]((map<unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_deqp::gls::FboUtil::config::Attachment_*>_>_>
                            *)this,(key_type_conflict *)((long)&local_28 + 4));
    *ppAVar4 = att;
  }
  return;
}

Assistant:

void FboBuilder::glAttach (GLenum attPoint, const Attachment* att)
{
	if (att == NULL)
		m_gl.framebufferRenderbuffer(m_target, attPoint, GL_RENDERBUFFER, 0);
	else
		attachAttachment(*att, attPoint, m_gl);
	checkError();
	attach(attPoint, att);
}